

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

void __thiscall YAML::Node::~Node(Node *this)

{
  long in_RDI;
  
  std::shared_ptr<YAML::detail::memory_holder>::~shared_ptr
            ((shared_ptr<YAML::detail::memory_holder> *)0x9dcf0c);
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  return;
}

Assistant:

inline Node::~Node() = default;